

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

void __thiscall
LongReadsMapper::map_reads_to_best_nodes
          (LongReadsMapper *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *readIDs)

{
  pointer pLVar1;
  bool bVar2;
  SatKmerIndex *this_00;
  NKmerIndex *this_01;
  ostream *poVar3;
  size_type sVar4;
  char *seq;
  ulong *puVar5;
  ulong uVar6;
  size_type __n;
  LongReadsMapper *this_02;
  uint64_t i;
  ulong __n_00;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *threadm;
  long lVar7;
  pointer pvVar8;
  reference rVar9;
  uint local_3c4;
  uint local_3c0;
  allocator_type local_3b9;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  shared_ptr<SatKmerIndex> skindex;
  shared_ptr<NKmerIndex> nkindex;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  vector<chain,_std::allocator<chain>_> best_window_chain;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  thread_mappings;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  vector<bool,_std::allocator<bool>_> kmer_in_assembly;
  ReadSequenceBuffer sequenceGetter;
  StreamKmerFactory skf;
  
  pLVar1 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl
      .super__Vector_impl_data._M_finish != pLVar1) {
    (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
  }
  nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this->sat_kmer_index == true) {
    this_00 = (SatKmerIndex *)operator_new(0x38);
    SatKmerIndex::SatKmerIndex(this_00,this->sg,this->k,(uint8_t)this->max_index_freq);
    std::__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<SatKmerIndex>
              (&skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>,this_00);
  }
  else {
    this_01 = (NKmerIndex *)operator_new(0x50);
    NKmerIndex::NKmerIndex(this_01,this->sg,this->k,this->max_index_freq);
    std::__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<NKmerIndex>
              (&nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>,this_01);
  }
  poVar3 = sdglib::OutputLog(INFO,true);
  poVar3 = std::operator<<(poVar3,"Index created");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::vector(&thread_mappings,1,(allocator_type *)&skf);
  KMerFactory::KMerFactory(&skf.super_KMerFactory,this->k);
  pvVar8 = thread_mappings.
           super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ReadSequenceBuffer::ReadSequenceBuffer(&sequenceGetter,this->datastore,0x1e00000,0x400000);
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&candidate_counts,
             (((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x38) * 2,
             (allocator_type *)&kmer_in_assembly);
  best_window_chain.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  best_window_chain.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  best_window_chain.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::chrono::_V2::system_clock::now();
  local_3c4 = 1;
  local_3c0 = 0;
  do {
    if (((long)(this->datastore->read_to_fileRecord).
               super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->datastore->read_to_fileRecord).
               super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
               super__Vector_impl_data._M_start >> 4) - 1U < (ulong)local_3c4) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Thread #");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
      poVar3 = std::operator<<(poVar3," times: ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3," total, ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3,"%)kmer-hit search, ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3,"%)internal chaining, ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3,"%)external chaining");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::_Vector_base<chain,_std::allocator<chain>_>::~_Vector_base
                (&best_window_chain.super__Vector_base<chain,_std::allocator<chain>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&candidate_counts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector(&node_matches);
      ReadSequenceBuffer::~ReadSequenceBuffer(&sequenceGetter);
      std::
      _Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
      ::~_Vector_base(&read_kmers.
                       super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                     );
      for (pvVar8 = thread_mappings.
                    super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar8 != thread_mappings.
                    super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pvVar8 = pvVar8 + 1) {
        std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
        insert<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,void>
                  ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)&this->mappings,
                   (this->mappings).
                   super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (pvVar8->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (pvVar8->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      poVar3 = sdglib::OutputLog(INFO,true);
      poVar3 = std::operator<<(poVar3,"Updating mapping indexes");
      std::endl<char,std::char_traits<char>>(poVar3);
      update_indexes(this);
      std::
      vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ::~vector(&thread_mappings);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    std::chrono::_V2::system_clock::now();
    local_3c0 = local_3c0 + 1;
    if (local_3c0 % 10000 == 0) {
      poVar3 = sdglib::OutputLog(INFO,true);
      poVar3 = std::operator<<(poVar3,"Thread #");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
      poVar3 = std::operator<<(poVar3," processing its read #");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    if (*(long *)(readIDs + 0x18) == 0) {
LAB_001e6bb1:
      if ((uint)(this->min_size * 2) <=
          (this->datastore->read_to_fileRecord).
          super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
          super__Vector_impl_data._M_start[local_3c4].record_size) {
        seq = ReadSequenceBuffer::get_read_sequence(&sequenceGetter,(ulong)local_3c4);
        if (read_kmers.
            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            read_kmers.
            super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          read_kmers.
          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               read_kmers.
               super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        this_02 = (LongReadsMapper *)&skf;
        StreamKmerFactory::produce_all_kmers((StreamKmerFactory *)this_02,seq,&read_kmers);
        __n = (long)read_kmers.
                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)read_kmers.
                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
        if ((ulong)((long)this->min_size * 2) <= __n) {
          if (this->sat_kmer_index == true) {
            get_sat_kmer_matches
                      (this_02,skindex.super___shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,&node_matches,&read_kmers);
          }
          else {
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)
                       &kmer_in_assembly.super__Bvector_base<std::allocator<bool>_>,__n,&local_3b9);
            lVar7 = 8;
            __n_00 = 0;
            while( true ) {
              if ((ulong)((long)read_kmers.
                                super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)read_kmers.
                                super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= __n_00) break;
              bVar2 = NKmerIndex::filter(nkindex.
                                         super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_ptr,*(uint64_t *)
                                                 (&(read_kmers.
                                                                                                        
                                                  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first
                                                 + lVar7));
              rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)
                                 &kmer_in_assembly.super__Bvector_base<std::allocator<bool>_>,__n_00
                                );
              puVar5 = rVar9._M_p;
              if (bVar2) {
                uVar6 = rVar9._M_mask | *puVar5;
              }
              else {
                uVar6 = ~rVar9._M_mask & *puVar5;
              }
              *puVar5 = uVar6;
              __n_00 = __n_00 + 1;
              lVar7 = lVar7 + 0x10;
            }
            get_all_kmer_matches
                      (this,nkindex.super___shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,&node_matches,&read_kmers,
                       (vector<bool,_std::allocator<bool>_> *)
                       &kmer_in_assembly.super__Bvector_base<std::allocator<bool>_>);
            std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                      (&kmer_in_assembly.super__Bvector_base<std::allocator<bool>_>);
          }
          std::chrono::_V2::system_clock::now();
          window_internal_chaining
                    (&best_window_chain,
                     (uint32_t)
                     ((ulong)((long)read_kmers.
                                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)read_kmers.
                                   super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4),&node_matches,
                     100);
          std::chrono::_V2::system_clock::now();
          window_external_chaining
                    (local_3c4,
                     (long)read_kmers.
                           super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)read_kmers.
                           super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4,pvVar8,&best_window_chain,
                     &node_matches,100);
          std::chrono::_V2::system_clock::now();
        }
      }
    }
    else {
      sVar4 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)readIDs,&local_3c4);
      if (sVar4 != 0) goto LAB_001e6bb1;
    }
    local_3c4 = local_3c4 + 1;
  } while( true );
}

Assistant:

void LongReadsMapper::map_reads_to_best_nodes(const std::unordered_set<uint32_t> &readIDs) {
    mappings.clear();
    std::shared_ptr<NKmerIndex> nkindex;
    std::shared_ptr<SatKmerIndex> skindex;
    if (sat_kmer_index) skindex.reset(new SatKmerIndex(sg,k,max_index_freq));
    else nkindex.reset(new NKmerIndex(sg,k,max_index_freq));
    sdglib::OutputLog() << "Index created" << std::endl;
    std::vector<std::vector<LongReadMapping>> thread_mappings(omp_get_max_threads());
    uint32_t num_reads_done(0);
    uint64_t no_matches(0),single_matches(0),multi_matches(0);
#pragma omp parallel default(none) shared(thread_mappings,nkindex,skindex,no_matches,single_matches,multi_matches,num_reads_done,readIDs) shared(std::cout)
    {
        StreamKmerFactory skf(k);
        std::vector<std::pair<bool, uint64_t>> read_kmers;

        auto & private_results=thread_mappings[omp_get_thread_num()];
        ReadSequenceBuffer sequenceGetter(datastore);
        std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
        const char * query_sequence_ptr;

        std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);
        std::vector<chain> best_window_chain;
        auto t=std::chrono::high_resolution_clock::now();
        auto tkhits=t-t,tichain=t-t,techain=t-t,ttoal=t-t;

#pragma omp for schedule(static,200) reduction(+:no_matches,single_matches,multi_matches,num_reads_done)
        for (uint32_t readID = 1; readID <= datastore.size(); ++readID) {
        //for (uint32_t readID = 598822; readID < 598823; ++readID) {
        //for (uint32_t readID = 3024; readID < 3024; ++readID) {

            auto t0=std::chrono::high_resolution_clock::now();
            if (++num_reads_done%10000 == 0) {
                sdglib::OutputLog() << "Thread #"<<omp_get_thread_num() <<" processing its read #" << num_reads_done << std::endl;
            }

            if ((!readIDs.empty() and readIDs.count(readID)==0 /*Read not in selected set*/)) {
                continue;
            }
            if (datastore.read_to_fileRecord[readID].record_size< 2 * min_size ) continue;
            //========== 1. Get read sequence, kmerise, get all matches ==========
            query_sequence_ptr = sequenceGetter.get_read_sequence(readID);
            read_kmers.clear();
            skf.produce_all_kmers(query_sequence_ptr, read_kmers);

            if ( read_kmers.size()< 2 * min_size) {
                continue;
            }

            // Create a vector for the lookup of read_kmers in the filter, then sort the ones that are in the filter
            // generate_matches using a sorted version which will make the lookups faster

            // sort them back in the order they came out of the reads

            if (sat_kmer_index) {
                get_sat_kmer_matches(*skindex,node_matches, read_kmers);
            } else {
                std::vector<bool> kmer_in_assembly(read_kmers.size());

                for (uint64_t i = 0; i < read_kmers.size(); ++i) {
                    kmer_in_assembly[i] = nkindex->filter(read_kmers[i].second);
                }
                get_all_kmer_matches(*nkindex, node_matches, read_kmers, kmer_in_assembly);
            }

            //========== 2. Find best chaining in fixed windows ==========
            //std::cout<<"Internal chaining for "<<readID<<std::endl;
            auto t1=std::chrono::high_resolution_clock::now();
            window_internal_chaining(best_window_chain,read_kmers.size(),node_matches,100);
            //std::cout<<"Best window matches for read #"<<readID<<std::endl;
//            for (auto bwc:best_window_chain) {
//                std::cout<<"Node: "<<bwc.node<<" Delta: "<<bwc.delta<<" Score: "<<bwc.score<<std::endl;
//            }
//            std::cout<<std::endl;
            //std::cout<<"External chaining for "<<readID<<std::endl;
            auto t2=std::chrono::high_resolution_clock::now();
            window_external_chaining(readID,read_kmers.size(),private_results,best_window_chain,node_matches,100);
//            for (auto r:private_results){
//                std::cout<<r<<std::endl;
//            }
            auto t3=std::chrono::high_resolution_clock::now();
            //private_results.insert(private_results.end(),fblocks.begin(),fblocks.end());
            tkhits+=t1-t0;
            tichain+=t2-t1;
            techain+=t3-t2;
            ttoal+=t3-t0;
        }
#pragma omp critical
        std::cout<<"Thread #"<<omp_get_thread_num()<<" times: "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(ttoal).count()<<" total, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(tkhits).count()<<" ("<<100*tkhits/ttoal<<"%)kmer-hit search, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(tichain).count()<<" ("<<100*tichain/ttoal<<"%)internal chaining, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(techain).count()<<" ("<<100*techain/ttoal<<"%)external chaining"<<std::endl;
    }
    //TODO: report read and win coverage by winners vs. by loosers
//    sdglib::OutputLog()<<"Read window results:    "<<window_low_score<<" low score    "<<window_close_second<<" close second    "<<window_hit<<" hits"<<std::endl;
//    sdglib::OutputLog()<<"Read results:    "<<no_matches<<" no match    "<<single_matches<<" single match    "<<multi_matches<<" multi matches"<<std::endl;
    for (auto & threadm : thread_mappings) {
        mappings.insert(mappings.end(),threadm.begin(),threadm.end());
    }
    sdglib::OutputLog() << "Updating mapping indexes" <<std::endl;
    update_indexes();
}